

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::calculateAngleInfo(btGeneric6DofSpring2Constraint *this)

{
  btMatrix3x3 *in_RDI;
  btVector3 bVar1;
  btVector3 axis2_3;
  btVector3 axis0_3;
  btVector3 axis2_2;
  btVector3 axis1_3;
  btVector3 axis1_2;
  btVector3 axis0_2;
  btVector3 axis2_1;
  btVector3 axis1_1;
  btVector3 axis1;
  btVector3 axis0_1;
  btVector3 axis2;
  btVector3 axis0;
  btMatrix3x3 relative_frame;
  btVector3 *in_stack_fffffffffffffd10;
  btVector3 *in_stack_fffffffffffffd18;
  btScalar *v;
  btMatrix3x3 *in_stack_fffffffffffffd20;
  btVector3 *this_00;
  btVector3 *in_stack_fffffffffffffd30;
  btMatrix3x3 *in_stack_fffffffffffffd38;
  btMatrix3x3 *in_stack_fffffffffffffd80;
  btMatrix3x3 *in_stack_fffffffffffffdb0;
  btVector3 local_208;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  btVector3 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  
  btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
  btMatrix3x3::inverse(in_stack_fffffffffffffd80);
  btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
  ::operator*(in_stack_fffffffffffffdb0,in_RDI);
  switch(in_RDI[0x1a].m_el[0].m_floats[2]) {
  case 0.0:
    matrixToEulerXYZ(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    break;
  case 1.4013e-45:
    matrixToEulerXZY(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    break;
  case 2.8026e-45:
    matrixToEulerYXZ(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    break;
  case 4.2039e-45:
    matrixToEulerYZX(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    break;
  case 5.60519e-45:
    matrixToEulerZXY(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    break;
  case 7.00649e-45:
    matrixToEulerZYX(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  }
  switch(in_RDI[0x1a].m_el[0].m_floats[2]) {
  case 0.0:
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_70 = bVar1.m_floats._8_8_;
    local_78 = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_80 = bVar1.m_floats._8_8_;
    local_88 = bVar1.m_floats._0_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_90 = bVar1.m_floats._8_8_;
    local_98 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 3) = local_98;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 1) = uStack_90;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_a0 = bVar1.m_floats._8_8_;
    local_a8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[0].m_floats + 3) = local_a8;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 1) = uStack_a0;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    local_b0 = bVar1.m_floats._8_8_;
    local_b8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 3) = local_b8;
    *(undefined8 *)(in_RDI[0x1e].m_el[0].m_floats + 1) = local_b0;
    break;
  case 1.4013e-45:
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_c0 = bVar1.m_floats._8_8_;
    local_c8 = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_d0 = bVar1.m_floats._8_8_;
    local_d8 = bVar1.m_floats._0_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_e0 = bVar1.m_floats._8_8_;
    local_e8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 3) = local_e8;
    *(undefined8 *)(in_RDI[0x1e].m_el[0].m_floats + 1) = uStack_e0;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_f0 = bVar1.m_floats._8_8_;
    local_f8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[0].m_floats + 3) = local_f8;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 1) = uStack_f0;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    local_100 = bVar1.m_floats._8_8_;
    local_108 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 3) = local_108;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 1) = local_100;
    break;
  case 2.8026e-45:
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_110 = bVar1.m_floats._8_8_;
    local_118 = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_120 = bVar1.m_floats._8_8_;
    local_128 = bVar1.m_floats._0_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_130 = bVar1.m_floats._8_8_;
    local_138 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[0].m_floats + 3) = local_138;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 1) = uStack_130;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_140 = bVar1.m_floats._8_8_;
    local_148 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 3) = local_148;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 1) = uStack_140;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    local_150 = bVar1.m_floats._8_8_;
    local_158 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 3) = local_158;
    *(undefined8 *)(in_RDI[0x1e].m_el[0].m_floats + 1) = local_150;
    break;
  case 4.2039e-45:
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_160 = bVar1.m_floats._8_8_;
    local_168 = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_170 = bVar1.m_floats._8_8_;
    local_178 = bVar1.m_floats._0_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_180 = bVar1.m_floats._8_8_;
    local_188 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 3) = local_188;
    *(undefined8 *)(in_RDI[0x1e].m_el[0].m_floats + 1) = uStack_180;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    uStack_190 = bVar1.m_floats._8_8_;
    local_198 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[0].m_floats + 3) = local_198;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 1) = uStack_190;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    local_1a0 = bVar1.m_floats._8_8_;
    local_1a8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 3) = local_1a8;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 1) = local_1a0;
    break;
  case 5.60519e-45:
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_1b0 = bVar1.m_floats._8_8_;
    local_1b8 = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_1c8.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_1c8.m_floats._0_8_ = bVar1.m_floats._0_8_;
    this_00 = &local_1c8;
    bVar1 = btVector3::cross(this_00,in_stack_fffffffffffffd18);
    uStack_1d0 = bVar1.m_floats._8_8_;
    local_1d8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[0].m_floats + 3) = local_1d8;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 1) = uStack_1d0;
    bVar1 = btVector3::cross(this_00,in_stack_fffffffffffffd18);
    uStack_1e0 = bVar1.m_floats._8_8_;
    local_1e8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[1].m_floats + 3) = local_1e8;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 1) = uStack_1e0;
    bVar1 = btVector3::cross(this_00,in_stack_fffffffffffffd18);
    local_1f0 = bVar1.m_floats._8_8_;
    local_1f8 = bVar1.m_floats._0_8_;
    *(undefined8 *)(in_RDI[0x1d].m_el[2].m_floats + 3) = local_1f8;
    *(undefined8 *)(in_RDI[0x1e].m_el[0].m_floats + 1) = local_1f0;
    break;
  case 7.00649e-45:
    btTransform::getBasis((btTransform *)(in_RDI[0x1a].m_el[0].m_floats + 3));
    bVar1 = btMatrix3x3::getColumn
                      (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    local_208.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_208.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btTransform::getBasis((btTransform *)(in_RDI[0x1b].m_el[1].m_floats + 3));
    btMatrix3x3::getColumn
              (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    in_stack_fffffffffffffd10 = &local_208;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,in_stack_fffffffffffffd18);
    v = in_RDI[0x1d].m_el[1].m_floats + 3;
    *(long *)(in_RDI[0x1d].m_el[1].m_floats + 3) = bVar1.m_floats._0_8_;
    *(long *)(in_RDI[0x1d].m_el[2].m_floats + 1) = bVar1.m_floats._8_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,(btVector3 *)v);
    *(long *)(in_RDI[0x1d].m_el[0].m_floats + 3) = bVar1.m_floats._0_8_;
    *(long *)(in_RDI[0x1d].m_el[1].m_floats + 1) = bVar1.m_floats._8_8_;
    bVar1 = btVector3::cross(in_stack_fffffffffffffd20->m_el,(btVector3 *)v);
    *(long *)(in_RDI[0x1d].m_el[2].m_floats + 3) = bVar1.m_floats._0_8_;
    *(long *)(in_RDI[0x1e].m_el[0].m_floats + 1) = bVar1.m_floats._8_8_;
  }
  btVector3::normalize(in_stack_fffffffffffffd10);
  btVector3::normalize(in_stack_fffffffffffffd10);
  btVector3::normalize(in_stack_fffffffffffffd10);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	switch (m_rotateOrder)
	{
		case RO_XYZ : matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_XZY : matrixToEulerXZY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YXZ : matrixToEulerYXZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YZX : matrixToEulerYZX(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZXY : matrixToEulerZXY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZYX : matrixToEulerZYX(relative_frame,m_calculatedAxisAngleDiff); break;
		default : btAssert(false);
	}
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	switch (m_rotateOrder)
	{
	case RO_XYZ :
		{
			//Is this the "line of nodes" calculation choosing planes YZ (B coordinate system) and xy (A coordinate system)? (http://en.wikipedia.org/wiki/Euler_angles)
			//The two planes are non-homologous, so this is a Tait�Bryan angle formalism and not a proper Euler
			//Extrinsic rotations are equal to the reversed order intrinsic rotations so the above xyz extrinsic rotations (axes are fixed) are the same as the zy'x" intrinsic rotations (axes are refreshed after each rotation)
			//that is why xy and YZ planes are chosen (this will describe a zy'x" intrinsic rotation) (see the figure on the left at http://en.wikipedia.org/wiki/Euler_angles under Tait�Bryan angles)
			// x' = Nperp = N.cross(axis2)
			// y' = N = axis2.cross(axis0)	
			// z' = z
			//
			// x" = X
			// y" = y'
			// z" = ??
			//in other words:
			//first rotate around z
			//second rotate around y'= z.cross(X)
			//third rotate around x" = X
			//Original XYZ extrinsic rotation order. 
			//Planes: xy and YZ normals: z, X.  Plane intersection (N) is z.cross(X)
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	case RO_XZY :
		{
			//planes: xz,ZY normals: y, X
			//first rotate around y
			//second rotate around z'= y.cross(X)
			//third rotate around x" = X
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_YXZ :
		{
			//planes: yx,XZ normals: z, Y
			//first rotate around z
			//second rotate around x'= z.cross(Y)
			//third rotate around y" = Y
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_YZX :
		{
			//planes: yz,ZX normals: x, Y
			//first rotate around x
			//second rotate around z'= x.cross(Y)
			//third rotate around y" = Y
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_ZXY :
		{
			//planes: zx,XY normals: y, Z
			//first rotate around y
			//second rotate around x'= y.cross(Z)
			//third rotate around z" = Z
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_ZYX :
		{
			//planes: zy,YX normals: x, Z
			//first rotate around x
			//second rotate around y' = x.cross(Z)
			//third rotate around z" = Z
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	default:
		btAssert(false);
	}

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}